

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O3

Matrix * MatrixRotateZYX(Matrix *__return_storage_ptr__,Vector3 ang)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float local_48;
  float fStack_44;
  
  fVar1 = cosf(ang.z);
  fVar2 = sinf(ang.z);
  fStack_44 = ang.y;
  fVar3 = cosf(fStack_44);
  fVar4 = sinf(fStack_44);
  local_48 = ang.x;
  fVar5 = cosf(local_48);
  fVar6 = sinf(local_48);
  __return_storage_ptr__->m0 = fVar3 * fVar1;
  __return_storage_ptr__->m4 = fVar3 * fVar2;
  __return_storage_ptr__->m1 = fVar6 * fVar1 * fVar4 + -(fVar2 * fVar5);
  __return_storage_ptr__->m5 = fVar5 * fVar1 + fVar2 * fVar4 * fVar6;
  __return_storage_ptr__->m2 = fVar6 * fVar2 + fVar4 * fVar1 * fVar5;
  __return_storage_ptr__->m6 = fVar4 * fVar2 * fVar5 + fVar6 * -fVar1;
  __return_storage_ptr__->m8 = -fVar4;
  __return_storage_ptr__->m9 = fVar3 * fVar6;
  __return_storage_ptr__->m10 = fVar3 * fVar5;
  __return_storage_ptr__->m12 = 0.0;
  __return_storage_ptr__->m13 = 0.0;
  __return_storage_ptr__->m14 = 0.0;
  __return_storage_ptr__->m3 = 0.0;
  __return_storage_ptr__->m7 = 0.0;
  __return_storage_ptr__->m11 = 0.0;
  __return_storage_ptr__->m15 = 1.0;
  return __return_storage_ptr__;
}

Assistant:

RMDEF Matrix MatrixRotateZYX(Vector3 ang)
{
    Matrix result = { 0 };

    float cz = cosf(ang.z);
    float sz = sinf(ang.z);
    float cy = cosf(ang.y);
    float sy = sinf(ang.y);
    float cx = cosf(ang.x);
    float sx = sinf(ang.x);

    result.m0 = cz*cy;
    result.m1 = cz*sy*sx - cx*sz;
    result.m2 = sz*sx + cz*cx*sy;
    result.m3 = 0;

    result.m4 = cy*sz;
    result.m5 = cz*cx + sz*sy*sx;
    result.m6 = cx*sz*sy - cz*sx;
    result.m7 = 0;

    result.m8 = -sy;
    result.m9 = cy*sx;
    result.m10 = cy*cx;
    result.m11 = 0;

    result.m12 = 0;
    result.m13 = 0;
    result.m14 = 0;
    result.m15 = 1;

    return result;
}